

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

bool * __thiscall
google::protobuf::RepeatedField<bool>::Mutable(RepeatedField<bool> *this,int index)

{
  return (bool *)((long)index + (long)this->arena_or_elements_);
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return &elements()[index];
}